

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_CoverIsCubeFree(Mvc_Cover_t *pCover)

{
  Mvc_CubeWord_t MVar1;
  Mvc_Cube_t *pMVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  pMVar2 = pCover->pMask;
  uVar4 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
  if (uVar4 == 0) {
    MVar1 = pMVar2->pData[0];
  }
  else {
    if (uVar4 != 1) {
      do {
        bVar5 = pMVar2->pData[uVar4] == 0;
        if (!bVar5) break;
        bVar3 = 0 < (int)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar3);
      goto LAB_008cc105;
    }
    if (pMVar2->pData[0] != 0) {
      bVar5 = false;
      goto LAB_008cc105;
    }
    MVar1 = *(Mvc_CubeWord_t *)&pMVar2->field_0x14;
  }
  bVar5 = MVar1 == 0;
LAB_008cc105:
  return (int)bVar5;
}

Assistant:

int Mvc_CoverIsCubeFree( Mvc_Cover_t * pCover )
{
    int Result;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // check whether the common cube is empty
    Mvc_CubeBitEmpty( Result, pCover->pMask );
    return Result;
}